

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

PageantClientOp * pageant_client_op_new(void)

{
  PageantClientOp *pPVar1;
  strbuf *psVar2;
  
  pPVar1 = (PageantClientOp *)safemalloc(1,0x40,0);
  psVar2 = strbuf_new_for_agent_query();
  pPVar1->buf = psVar2;
  pPVar1->request_made = false;
  pPVar1->binarysink_ = psVar2->binarysink_;
  pPVar1->binarysource_[0].data = "";
  pPVar1->binarysource_[0].pos = 0;
  pPVar1->binarysource_[0].len = 0;
  pPVar1->binarysource_[0].err = BSE_NO_ERROR;
  pPVar1->binarysource_[0].binarysource_ = pPVar1->binarysource_;
  return pPVar1;
}

Assistant:

static PageantClientOp *pageant_client_op_new(void)
{
    PageantClientOp *pco = snew(PageantClientOp);
    pco->buf = strbuf_new_for_agent_query();
    pco->request_made = false;
    BinarySink_DELEGATE_INIT(pco, pco->buf);
    BinarySource_INIT(pco, "", 0);
    return pco;
}